

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O1

void __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,3,1,-1,3>const,0,Eigen::OuterStride<-1>>>::
construct<Eigen::Map<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>const>
          (RefBase<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
           *this,Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *expr
          )

{
  PointerType pdVar1;
  long lVar2;
  
  pdVar1 = (expr->
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
           ).m_data;
  lVar2 = (expr->
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
          ).m_rows.m_value;
  *(PointerType *)this = pdVar1;
  *(long *)(this + 8) = lVar2;
  if (lVar2 < 0 && pdVar1 != (PointerType)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                  ,0xb0,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 3>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 3>>, Level = 0]"
                 );
  }
  lVar2 = (expr->m_stride).super_Stride<_1,_0>.m_outer.m_value;
  *(long *)(this + 0x18) = lVar2;
  if (-1 < lVar2) {
    return;
  }
  __assert_fail("innerStride>=0 && outerStride>=0",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/Stride.h"
                ,0x42,
                "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC void construct(Expression& expr)
  {
    EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(PlainObjectType,Expression);

    if(PlainObjectType::RowsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      ::new (static_cast<Base*>(this)) Base(expr.data(), 1, expr.size());
    }
    else if(PlainObjectType::ColsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      ::new (static_cast<Base*>(this)) Base(expr.data(), expr.size(), 1);
    }
    else
      ::new (static_cast<Base*>(this)) Base(expr.data(), expr.rows(), expr.cols());
    
    if(Expression::IsVectorAtCompileTime && (!PlainObjectType::IsVectorAtCompileTime) && ((Expression::Flags&RowMajorBit)!=(PlainObjectType::Flags&RowMajorBit)))
      ::new (&m_stride) StrideBase(expr.innerStride(), StrideType::InnerStrideAtCompileTime==0?0:1);
    else
      ::new (&m_stride) StrideBase(StrideType::OuterStrideAtCompileTime==0?0:expr.outerStride(),
                                   StrideType::InnerStrideAtCompileTime==0?0:expr.innerStride());    
  }